

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O2

ma_result ma_allocation_callbacks_init_copy
                    (ma_allocation_callbacks *pDst,ma_allocation_callbacks *pSrc)

{
  void *pvVar1;
  _func_void_ptr_size_t_void_ptr *p_Var2;
  _func_void_void_ptr_void_ptr *p_Var3;
  
  if (pDst == (ma_allocation_callbacks *)0x0) {
    return MA_INVALID_ARGS;
  }
  if (pSrc == (ma_allocation_callbacks *)0x0) {
LAB_00139235:
    pDst->pUserData = (void *)0x0;
    pDst->onMalloc = ma__malloc_default;
    pDst->onRealloc = ma__realloc_default;
    pDst->onFree = ma__free_default;
  }
  else {
    if (pSrc->pUserData == (void *)0x0) {
      if (pSrc->onFree == (_func_void_void_ptr_void_ptr *)0x0) {
        if (pSrc->onMalloc != (_func_void_ptr_size_t_void_ptr *)0x0) {
          return MA_INVALID_ARGS;
        }
        if (pSrc->onRealloc != (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0) {
          return MA_INVALID_ARGS;
        }
        goto LAB_00139235;
      }
    }
    else if (pSrc->onFree == (_func_void_void_ptr_void_ptr *)0x0) {
      return MA_INVALID_ARGS;
    }
    if ((pSrc->onMalloc == (_func_void_ptr_size_t_void_ptr *)0x0) &&
       (pSrc->onRealloc == (_func_void_ptr_void_ptr_size_t_void_ptr *)0x0)) {
      return MA_INVALID_ARGS;
    }
    pvVar1 = pSrc->pUserData;
    p_Var2 = pSrc->onMalloc;
    p_Var3 = pSrc->onFree;
    pDst->onRealloc = pSrc->onRealloc;
    pDst->onFree = p_Var3;
    pDst->pUserData = pvVar1;
    pDst->onMalloc = p_Var2;
  }
  return MA_SUCCESS;
}

Assistant:

static ma_result ma_allocation_callbacks_init_copy(ma_allocation_callbacks* pDst, const ma_allocation_callbacks* pSrc)
{
    if (pDst == NULL) {
        return MA_INVALID_ARGS;
    }

    if (pSrc == NULL) {
        *pDst = ma_allocation_callbacks_init_default();
    } else {
        if (pSrc->pUserData == NULL && pSrc->onFree == NULL && pSrc->onMalloc == NULL && pSrc->onRealloc == NULL) {
            *pDst = ma_allocation_callbacks_init_default();
        } else {
            if (pSrc->onFree == NULL || (pSrc->onMalloc == NULL && pSrc->onRealloc == NULL)) {
                return MA_INVALID_ARGS;    /* Invalid allocation callbacks. */
            } else {
                *pDst = *pSrc;
            }
        }
    }

    return MA_SUCCESS;
}